

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::CwiseQuotient::dim_forward
          (Dim *__return_storage_ptr__,CwiseQuotient *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  pointer pDVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  invalid_argument *this_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  Dim r_1;
  Dim r;
  undefined8 uStack_1c8;
  undefined4 uStack_1c0;
  undefined4 local_1bc;
  undefined4 uStack_1b8;
  undefined8 uStack_1b4;
  uint local_1ac;
  undefined4 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  uint local_180;
  uint local_17c;
  undefined4 local_178;
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar3 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x317,"virtual Dim cnn::CwiseQuotient::dim_forward(const vector<Dim> &) const");
  }
  uVar13 = 1;
  iVar12 = 1;
  __return_storage_ptr__->bd = pDVar3->bd;
  uVar7 = *(undefined8 *)(pDVar3->d + 2);
  uVar10 = *(undefined8 *)(pDVar3->d + 4);
  uVar11 = *(undefined8 *)(pDVar3->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar3->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar10;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar11;
  uVar2 = pDVar3->nd;
  if ((ulong)uVar2 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar16 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar18 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar3->d + uVar16));
      auVar24._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar20._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar20._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar20._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar20._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar20._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar20._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar20._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      uVar16 = uVar16 + 0x10;
      auVar20 = vpmulld_avx512f(auVar24,auVar25);
    } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar21._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * auVar20._4_4_ | (uint)!bVar4 * auVar25._4_4_;
    bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar4 * auVar20._8_4_ | (uint)!bVar4 * auVar25._8_4_;
    bVar4 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar4 * auVar20._12_4_ | (uint)!bVar4 * auVar25._12_4_;
    bVar4 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar4 * auVar20._16_4_ | (uint)!bVar4 * auVar25._16_4_;
    bVar4 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar4 * auVar20._20_4_ | (uint)!bVar4 * auVar25._20_4_;
    bVar4 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar4 * auVar20._24_4_ | (uint)!bVar4 * auVar25._24_4_;
    bVar4 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar4 * auVar20._28_4_ | (uint)!bVar4 * auVar25._28_4_;
    auVar21._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar4 * auVar20._36_4_ | (uint)!bVar4 * auVar25._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar4 * auVar20._40_4_ | (uint)!bVar4 * auVar25._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar4 * auVar20._44_4_ | (uint)!bVar4 * auVar25._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar4 * auVar20._48_4_ | (uint)!bVar4 * auVar25._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar4 * auVar20._52_4_ | (uint)!bVar4 * auVar25._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar4 * auVar20._56_4_ | (uint)!bVar4 * auVar25._56_4_;
    auVar21._60_4_ =
         (uint)(bVar9 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar21,1);
    auVar20 = vpmulld_avx512f(auVar21,ZEXT3264(auVar19));
    auVar5 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar12 = auVar5._0_4_;
  }
  uVar14 = iVar12 * pDVar3->bd;
  if (1 < uVar14) {
    uVar15 = 1;
    uVar13 = 1;
    do {
      if ((uVar15 < uVar2) && (1 < pDVar3->d[uVar15])) {
        uVar13 = uVar15 + 1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar14);
  }
  __return_storage_ptr__->nd = uVar13;
  iVar12 = 1;
  local_198 = *(undefined8 *)__return_storage_ptr__->d;
  uStack_190 = *(undefined8 *)(__return_storage_ptr__->d + 2);
  local_188 = *(undefined8 *)(__return_storage_ptr__->d + 4);
  local_180 = __return_storage_ptr__->d[6];
  local_17c = __return_storage_ptr__->nd;
  pDVar1 = pDVar3 + 1;
  local_1ac = 1;
  local_178 = 1;
  uVar2 = pDVar3[1].nd;
  if ((ulong)uVar2 != 0) {
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f();
    uVar16 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar20);
      auVar20 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar20,auVar23,2);
      bVar9 = (byte)uVar7;
      uVar18 = CONCAT11(bVar9,bVar8);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar16));
      auVar26._4_4_ = (uint)((byte)(uVar18 >> 1) & 1) * auVar20._4_4_;
      auVar26._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar20._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar20._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar18 >> 4) & 1) * auVar20._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar18 >> 5) & 1) * auVar20._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar18 >> 6) & 1) * auVar20._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar18 >> 7) & 1) * auVar20._28_4_;
      auVar26._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_;
      auVar26._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar20._36_4_;
      auVar26._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar20._40_4_;
      auVar26._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar20._44_4_;
      auVar26._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar20._48_4_;
      auVar26._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar20._52_4_;
      auVar26._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar20._56_4_;
      auVar26._60_4_ = (uint)(bVar9 >> 7) * auVar20._60_4_;
      uVar16 = uVar16 + 0x10;
      auVar20 = vpmulld_avx512f(auVar26,auVar25);
    } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar16);
    auVar20 = vmovdqa32_avx512f(auVar20);
    auVar22._0_4_ = (uint)(bVar8 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
    bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar4 * auVar20._4_4_ | (uint)!bVar4 * auVar25._4_4_;
    bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar4 * auVar20._8_4_ | (uint)!bVar4 * auVar25._8_4_;
    bVar4 = (bool)((byte)(uVar18 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar4 * auVar20._12_4_ | (uint)!bVar4 * auVar25._12_4_;
    bVar4 = (bool)((byte)(uVar18 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar4 * auVar20._16_4_ | (uint)!bVar4 * auVar25._16_4_;
    bVar4 = (bool)((byte)(uVar18 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar4 * auVar20._20_4_ | (uint)!bVar4 * auVar25._20_4_;
    bVar4 = (bool)((byte)(uVar18 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar4 * auVar20._24_4_ | (uint)!bVar4 * auVar25._24_4_;
    bVar4 = (bool)((byte)(uVar18 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar4 * auVar20._28_4_ | (uint)!bVar4 * auVar25._28_4_;
    auVar22._32_4_ = (uint)(bVar9 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar25._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar4 * auVar20._36_4_ | (uint)!bVar4 * auVar25._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar4 * auVar20._40_4_ | (uint)!bVar4 * auVar25._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar4 * auVar20._44_4_ | (uint)!bVar4 * auVar25._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar4 * auVar20._48_4_ | (uint)!bVar4 * auVar25._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar4 * auVar20._52_4_ | (uint)!bVar4 * auVar25._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar4 * auVar20._56_4_ | (uint)!bVar4 * auVar25._56_4_;
    auVar22._60_4_ =
         (uint)(bVar9 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar25._60_4_;
    auVar19 = vextracti64x4_avx512f(auVar22,1);
    auVar20 = vpmulld_avx512f(auVar22,ZEXT3264(auVar19));
    auVar5 = vpmulld_avx(auVar20._0_16_,auVar20._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar12 = auVar5._0_4_;
  }
  uVar13 = pDVar3[1].bd;
  uVar14 = iVar12 * uVar13;
  if (1 < uVar14) {
    uVar15 = 1;
    local_1ac = 1;
    do {
      if ((uVar15 < uVar2) && (1 < pDVar1->d[uVar15])) {
        local_1ac = uVar15 + 1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar14);
  }
  uStack_1c8 = *(undefined8 *)pDVar1->d;
  uStack_1b4 = *(undefined8 *)(pDVar3[1].d + 5);
  uStack_1b8 = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 3) >> 0x20);
  uStack_1c0 = (undefined4)*(undefined8 *)(pDVar3[1].d + 2);
  local_1bc = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 2) >> 0x20);
  local_1a8 = 1;
  if ((local_17c == local_1ac) &&
     (iVar12 = bcmp(&local_198,&uStack_1c8,(ulong)local_1ac), iVar12 == 0)) {
    puVar17 = &pDVar3[1].bd;
    if (uVar13 < __return_storage_ptr__->bd) {
      puVar17 = &__return_storage_ptr__->bd;
    }
    __return_storage_ptr__->bd = *puVar17;
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Bad input dimensions in CwiseQuotient: ",0x27);
  operator<<((ostream *)&local_198,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&uStack_1c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}